

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdMtlx.cc
# Opt level: O0

Property *
tinyusdz::detail::MakeProperty<tinyusdz::Token>(Property *__return_storage_ptr__,Token *value)

{
  undefined1 local_2c0 [8];
  Attribute attr;
  Token *value_local;
  Property *prop;
  
  attr._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)value;
  Attribute::Attribute<tinyusdz::Token>((Attribute *)local_2c0,value,true);
  Property::Property(__return_storage_ptr__,(Attribute *)local_2c0,false);
  Attribute::~Attribute((Attribute *)local_2c0);
  return __return_storage_ptr__;
}

Assistant:

Property MakeProperty(const T &value) {
  Attribute attr(value);
  Property prop(attr, /* custom */ false);

  return prop;
}